

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

int match_ldds(MDD *one,MDD *two)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong *puVar7;
  ulong *puVar8;
  
  uVar4 = *one;
  uVar3 = *two;
  iVar2 = 0;
  if (uVar3 != 0 && uVar4 != 0) {
    puVar1 = nodes->data;
    uVar5 = *(uint *)(puVar1 + uVar4 * 0x10 + 6);
    uVar6 = *(uint *)(puVar1 + uVar3 * 0x10 + 6);
    if (uVar5 != uVar6) {
      puVar7 = (ulong *)(puVar1 + uVar4 * 0x10);
      puVar8 = (ulong *)(puVar1 + uVar3 * 0x10);
      do {
        if (uVar5 < uVar6) {
          uVar4 = *puVar7 >> 1 & 0x7fffffffffff;
          if (uVar4 == 0) {
            return 0;
          }
          puVar7 = (ulong *)(puVar1 + uVar4 * 0x10);
          uVar5 = *(uint *)(puVar1 + uVar4 * 0x10 + 6);
        }
        else if (uVar6 < uVar5) {
          uVar3 = *puVar8 >> 1 & 0x7fffffffffff;
          if (uVar3 == 0) {
            return 0;
          }
          uVar6 = *(uint *)(puVar1 + uVar3 * 0x10 + 6);
          puVar8 = (ulong *)(puVar1 + uVar3 * 0x10);
        }
      } while (uVar5 != uVar6);
    }
    iVar2 = 1;
    *one = uVar4;
    *two = uVar3;
  }
  return iVar2;
}

Assistant:

static inline int
match_ldds(MDD *one, MDD *two)
{
    MDD m1 = *one, m2 = *two;
    if (m1 == lddmc_false || m2 == lddmc_false) return 0;
    mddnode_t n1 = LDD_GETNODE(m1), n2 = LDD_GETNODE(m2);
    uint32_t v1 = mddnode_getvalue(n1), v2 = mddnode_getvalue(n2);
    while (v1 != v2) {
        if (v1 < v2) {
            m1 = mddnode_getright(n1);
            if (m1 == lddmc_false) return 0;
            n1 = LDD_GETNODE(m1);
            v1 = mddnode_getvalue(n1);
        } else if (v1 > v2) {
            m2 = mddnode_getright(n2);
            if (m2 == lddmc_false) return 0;
            n2 = LDD_GETNODE(m2);
            v2 = mddnode_getvalue(n2);
        }
    }
    *one = m1;
    *two = m2;
    return 1;
}